

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

CompressionFunction *
duckdb::FixedSizeGetFunction<duckdb::uhugeint_t,duckdb::StandardFixedSizeAppend>
          (PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_UNCOMPRESSED;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = FixedSizeInitAnalyze;
  in_RDI->analyze = FixedSizeAnalyze;
  in_RDI->final_analyze = FixedSizeFinalAnalyze<duckdb::uhugeint_t>;
  in_RDI->init_compression = UncompressedFunctions::InitCompression;
  in_RDI->compress = UncompressedFunctions::Compress;
  in_RDI->compress_finalize = UncompressedFunctions::FinalizeCompress;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = FixedSizeInitScan;
  in_RDI->scan_vector = FixedSizeScan<duckdb::uhugeint_t>;
  in_RDI->scan_partial = FixedSizeScanPartial<duckdb::uhugeint_t>;
  in_RDI->select = (compression_select_t)0x0;
  in_RDI->filter = (compression_filter_t)0x0;
  in_RDI->fetch_row = FixedSizeFetchRow<duckdb::uhugeint_t>;
  in_RDI->skip = UncompressedFunctions::EmptySkip;
  in_RDI->init_segment = (compression_init_segment_t)0x0;
  in_RDI->init_append = FixedSizeInitAppend;
  in_RDI->append = FixedSizeAppend<duckdb::uhugeint_t,duckdb::StandardFixedSizeAppend>;
  in_RDI->finalize_append = FixedSizeFinalizeAppend<duckdb::uhugeint_t>;
  *(undefined8 *)((long)&in_RDI->cleanup_state + 1) = 0;
  *(undefined8 *)((long)&in_RDI->get_segment_info + 1) = 0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  return in_RDI;
}

Assistant:

CompressionFunction FixedSizeGetFunction(PhysicalType data_type) {
	return CompressionFunction(CompressionType::COMPRESSION_UNCOMPRESSED, data_type, FixedSizeInitAnalyze,
	                           FixedSizeAnalyze, FixedSizeFinalAnalyze<T>, UncompressedFunctions::InitCompression,
	                           UncompressedFunctions::Compress, UncompressedFunctions::FinalizeCompress,
	                           FixedSizeInitScan, FixedSizeScan<T>, FixedSizeScanPartial<T>, FixedSizeFetchRow<T>,
	                           UncompressedFunctions::EmptySkip, nullptr, FixedSizeInitAppend,
	                           FixedSizeAppend<T, APPENDER>, FixedSizeFinalizeAppend<T>);
}